

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O3

void __thiscall
duckdb::FSSTCompressionState::CreateEmptySegment(FSSTCompressionState *this,idx_t row_start)

{
  BlockManager *pBVar1;
  CompressionFunction *function;
  pointer __p;
  ColumnSegment *pCVar2;
  DatabaseInstance *db;
  LogicalType *type;
  idx_t iVar3;
  idx_t iVar4;
  pointer local_40;
  __atomic_base<unsigned_long> local_38;
  
  local_38._M_i = row_start;
  db = ColumnDataCheckpointData::GetDatabase(this->checkpoint_data);
  type = ColumnDataCheckpointData::GetType(this->checkpoint_data);
  pBVar1 = (this->super_CompressionState).info.block_manager;
  function = this->function;
  iVar3 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar4 = optional_idx::GetIndex(&pBVar1->block_header_size);
  ColumnSegment::CreateTransientSegment
            ((ColumnSegment *)&stack0xffffffffffffffc0,db,function,type,local_38._M_i,iVar3 - iVar4,
             (this->super_CompressionState).info.block_manager);
  __p = local_40;
  local_40 = (ColumnSegment *)0x0;
  ::std::__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::reset
            ((__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
             &this->current_segment,__p);
  Reset(this);
  pCVar2 = local_40;
  if (local_40 != (ColumnSegment *)0x0) {
    ColumnSegment::~ColumnSegment(local_40);
    operator_delete(pCVar2);
  }
  return;
}

Assistant:

void CreateEmptySegment(idx_t row_start) {
		auto &db = checkpoint_data.GetDatabase();
		auto &type = checkpoint_data.GetType();

		auto compressed_segment = ColumnSegment::CreateTransientSegment(db, function, type, row_start,
		                                                                info.GetBlockSize(), info.GetBlockManager());
		current_segment = std::move(compressed_segment);
		Reset();
	}